

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O0

CURLcode cf_hc_connect(Curl_cfilter *cf,Curl_easy *data,_Bool *done)

{
  undefined4 *puVar1;
  _Bool _Var2;
  curltime cVar3;
  curltime now_00;
  undefined4 uStack_64;
  long local_60;
  size_t failed_ballers;
  size_t i;
  CURLcode result;
  curltime now;
  cf_hc_ctx *ctx;
  _Bool *done_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  puVar1 = (undefined4 *)cf->ctx;
  i._4_4_ = CURLE_OK;
  if ((cf->field_0x24 & 1) != 0) {
    *done = true;
    return CURLE_OK;
  }
  *done = false;
  cVar3 = Curl_now();
  switch(*puVar1) {
  case 0:
    for (failed_ballers = 0; failed_ballers < *(ulong *)(puVar1 + 0x26);
        failed_ballers = failed_ballers + 1) {
    }
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
      Curl_trc_cf_infof(data,cf,"connect, init");
    }
    *(time_t *)(puVar1 + 4) = cVar3.tv_sec;
    *(ulong *)(puVar1 + 6) = CONCAT44(uStack_64,cVar3.tv_usec);
    cf_hc_baller_init((cf_hc_baller *)(puVar1 + 10),cf,data,(uint)cf->conn->transport);
    if (((((1 < *(ulong *)(puVar1 + 0x26)) &&
          (Curl_expire(data,(ulong)(uint)puVar1[0x28],EXPIRE_ALPN_EYEBALLS),
          data != (Curl_easy *)0x0)) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
      Curl_trc_cf_infof(data,cf,"set next attempt to start in %ums",(ulong)(uint)puVar1[0x28]);
    }
    *puVar1 = 1;
  case 1:
    _Var2 = cf_hc_baller_is_active((cf_hc_baller *)(puVar1 + 10));
    if (((_Var2) &&
        (i._4_4_ = cf_hc_baller_connect((cf_hc_baller *)(puVar1 + 10),cf,data,done),
        i._4_4_ == CURLE_OK)) && ((*done & 1U) != 0)) {
      i._4_4_ = baller_connected(cf,data,(cf_hc_baller *)(puVar1 + 10));
    }
    else {
      now_00._12_4_ = 0;
      now_00.tv_sec = SUB128(cVar3._0_12_,0);
      now_00.tv_usec = SUB124(cVar3._0_12_,8);
      _Var2 = time_to_start_next(cf,data,1,now_00);
      if (_Var2) {
        cf_hc_baller_init((cf_hc_baller *)(puVar1 + 0x18),cf,data,(uint)cf->conn->transport);
      }
      if ((1 < *(ulong *)(puVar1 + 0x26)) &&
         (_Var2 = cf_hc_baller_is_active((cf_hc_baller *)(puVar1 + 0x18)), _Var2)) {
        if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0))
           && (((((data->state).feat == (curl_trc_feat *)0x0 ||
                 (0 < ((data->state).feat)->log_level)) && (cf != (Curl_cfilter *)0x0)) &&
               (0 < cf->cft->log_level)))) {
          Curl_trc_cf_infof(data,cf,"connect, check %s",*(undefined8 *)(puVar1 + 0x18));
        }
        i._4_4_ = cf_hc_baller_connect((cf_hc_baller *)(puVar1 + 0x18),cf,data,done);
        if ((i._4_4_ == CURLE_OK) && ((*done & 1U) != 0)) {
          i._4_4_ = baller_connected(cf,data,(cf_hc_baller *)(puVar1 + 0x18));
          break;
        }
      }
      local_60 = 0;
      for (failed_ballers = 0; failed_ballers < *(ulong *)(puVar1 + 0x26);
          failed_ballers = failed_ballers + 1) {
        if (puVar1[failed_ballers * 0xe + 0xe] != 0) {
          local_60 = local_60 + 1;
        }
      }
      if (local_60 == *(long *)(puVar1 + 0x26)) {
        if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0))
            && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) && ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
          Curl_trc_cf_infof(data,cf,"connect, all attempts failed");
        }
        for (failed_ballers = 0; failed_ballers < *(ulong *)(puVar1 + 0x26);
            failed_ballers = failed_ballers + 1) {
          if (puVar1[failed_ballers * 0xe + 0xe] != 0) {
            i._4_4_ = puVar1[failed_ballers * 0xe + 0xe];
            break;
          }
        }
        *puVar1 = 3;
      }
      else {
        i._4_4_ = CURLE_OK;
        *done = false;
      }
    }
    break;
  case 2:
    i._4_4_ = CURLE_OK;
    cf->field_0x24 = cf->field_0x24 & 0xfe | 1;
    *done = true;
    break;
  case 3:
    i._4_4_ = puVar1[8];
    cf->field_0x24 = cf->field_0x24 & 0xfe;
    *done = false;
  }
  if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
      (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
     ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
    Curl_trc_cf_infof(data,cf,"connect -> %d, done=%d",(ulong)i._4_4_,(ulong)(*done & 1));
  }
  return i._4_4_;
}

Assistant:

static CURLcode cf_hc_connect(struct Curl_cfilter *cf,
                              struct Curl_easy *data,
                              bool *done)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  struct curltime now;
  CURLcode result = CURLE_OK;
  size_t i, failed_ballers;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  *done = FALSE;
  now = Curl_now();
  switch(ctx->state) {
  case CF_HC_INIT:
    DEBUGASSERT(!cf->next);
    for(i = 0; i < ctx->baller_count; i++)
      DEBUGASSERT(!ctx->ballers[i].cf);
    CURL_TRC_CF(data, cf, "connect, init");
    ctx->started = now;
    cf_hc_baller_init(&ctx->ballers[0], cf, data, cf->conn->transport);
    if(ctx->baller_count > 1) {
      Curl_expire(data, ctx->soft_eyeballs_timeout_ms, EXPIRE_ALPN_EYEBALLS);
      CURL_TRC_CF(data, cf, "set next attempt to start in %ums",
                  ctx->soft_eyeballs_timeout_ms);
    }
    ctx->state = CF_HC_CONNECT;
    FALLTHROUGH();

  case CF_HC_CONNECT:
    if(cf_hc_baller_is_active(&ctx->ballers[0])) {
      result = cf_hc_baller_connect(&ctx->ballers[0], cf, data, done);
      if(!result && *done) {
        result = baller_connected(cf, data, &ctx->ballers[0]);
        goto out;
      }
    }

    if(time_to_start_next(cf, data, 1, now)) {
      cf_hc_baller_init(&ctx->ballers[1], cf, data, cf->conn->transport);
    }

    if((ctx->baller_count > 1) && cf_hc_baller_is_active(&ctx->ballers[1])) {
      CURL_TRC_CF(data, cf, "connect, check %s", ctx->ballers[1].name);
      result = cf_hc_baller_connect(&ctx->ballers[1], cf, data, done);
      if(!result && *done) {
        result = baller_connected(cf, data, &ctx->ballers[1]);
        goto out;
      }
    }

    failed_ballers = 0;
    for(i = 0; i < ctx->baller_count; i++) {
      if(ctx->ballers[i].result)
        ++failed_ballers;
    }

    if(failed_ballers == ctx->baller_count) {
      /* all have failed. we give up */
      CURL_TRC_CF(data, cf, "connect, all attempts failed");
      for(i = 0; i < ctx->baller_count; i++) {
        if(ctx->ballers[i].result) {
          result = ctx->ballers[i].result;
          break;
        }
      }
      ctx->state = CF_HC_FAILURE;
      goto out;
    }
    result = CURLE_OK;
    *done = FALSE;
    break;

  case CF_HC_FAILURE:
    result = ctx->result;
    cf->connected = FALSE;
    *done = FALSE;
    break;

  case CF_HC_SUCCESS:
    result = CURLE_OK;
    cf->connected = TRUE;
    *done = TRUE;
    break;
  }

out:
  CURL_TRC_CF(data, cf, "connect -> %d, done=%d", result, *done);
  return result;
}